

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.h
# Opt level: O3

string * __thiscall
ctemplate::TemplateModifier::operator()
          (string *__return_storage_ptr__,TemplateModifier *this,char *in,size_t inlen,string *arg)

{
  StringEmitter outbuf;
  undefined **local_40;
  string *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_40 = &PTR__ExpandEmitter_00125c80;
  local_38 = __return_storage_ptr__;
  (*(code *)**(undefined8 **)this)(this,in,inlen,0,&local_40,arg);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const char* in, size_t inlen, const std::string& arg="") const {
    std::string out;
    // we'll reserve some space to account for minimal escaping: say 12%
    out.reserve(inlen + inlen/8 + 16);
    StringEmitter outbuf(&out);
    Modify(in, inlen, NULL, &outbuf, arg);
    return out;
  }